

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void __thiscall
mp::
CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
::CustomFunctionalConstraint
          (CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
           *this,Arguments *args)

{
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_> *in_RSI;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_> *in_RDI;
  
  FunctionalConstraint::FunctionalConstraint
            ((FunctionalConstraint *)in_RSI,(int)((ulong)in_RDI >> 0x20));
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>::AlgebraicConstraint(in_RSI,in_RDI);
  CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
  ::CustomConstraintData
            ((CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
              *)in_RSI,in_RDI);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>::~AlgebraicConstraint(in_RSI);
  return;
}

Assistant:

CustomFunctionalConstraint(Arguments args) noexcept :
    BaseType(std::move(args)) { }